

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

double __thiscall ANN::net_error(ANN *this,Matrix *error)

{
  Shape *pSVar1;
  vector<double,_std::allocator<double>_> *this_00;
  const_reference pvVar2;
  double dVar3;
  uint local_24;
  double dStack_20;
  uint i;
  double err;
  Matrix *error_local;
  ANN *this_local;
  
  dStack_20 = 0.0;
  local_24 = 0;
  while( true ) {
    pSVar1 = Matrix::shape(error);
    if ((pSVar1->field_0).m_dims[1] <= local_24) break;
    this_00 = Matrix::operator[](error,0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_24);
    dVar3 = pow(*pvVar2,2.0);
    dStack_20 = dVar3 * 0.5 + dStack_20;
    local_24 = local_24 + 1;
  }
  return dStack_20;
}

Assistant:

double ANN::net_error(const Matrix& error) const{
    double err=0.;

    for(uint i=0;i<error.shape().n_col;++i){
        err+=0.5*pow(error[0][i], 2);
    }

    return err;
}